

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

size_t phosg::parse_size(char *str)

{
  int iVar1;
  ulong uVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double local_30;
  double factor;
  size_t unit_scale;
  size_t integer_part;
  double fractional_part;
  char *str_local;
  
  integer_part = 0;
  unit_scale = 0;
  factor = 4.94065645841247e-324;
  fractional_part = (double)str;
  while (iVar1 = isdigit((int)*(char *)fractional_part), iVar1 != 0) {
    unit_scale = unit_scale * 10 + (long)(*(char *)fractional_part + -0x30);
    fractional_part = (double)((long)fractional_part + 1);
  }
  if (*(char *)fractional_part == '.') {
    local_30 = 0.1;
    while( true ) {
      fractional_part = (double)((long)fractional_part + 1);
      iVar1 = isdigit((int)*(char *)fractional_part);
      if (iVar1 == 0) break;
      integer_part = (size_t)(local_30 * (double)(*(char *)fractional_part + -0x30) +
                             (double)integer_part);
      local_30 = local_30 * 0.1;
    }
  }
  for (; *(char *)fractional_part == ' '; fractional_part = (double)((long)fractional_part + 1)) {
  }
  if ((*(char *)fractional_part == 'K') || (*(char *)fractional_part == 'k')) {
    factor = 5.05923221341436e-321;
  }
  else if ((*(char *)fractional_part == 'M') || (*(char *)fractional_part == 'm')) {
    factor = 5.18065378653631e-318;
  }
  else if ((*(char *)fractional_part == 'G') || (*(char *)fractional_part == 'g')) {
    factor = 5.30498947741318e-315;
  }
  else if ((*(char *)fractional_part == 'T') || (*(char *)fractional_part == 't')) {
    factor = 5.4323092248711e-312;
  }
  else if ((*(char *)fractional_part == 'P') || (*(char *)fractional_part == 'p')) {
    factor = 5.562684646268003e-309;
  }
  else if ((*(char *)fractional_part == 'E') || (*(char *)fractional_part == 'e')) {
    factor = 1.2882297539194267e-231;
  }
  auVar4._8_4_ = (int)((ulong)factor >> 0x20);
  auVar4._0_8_ = factor;
  auVar4._12_4_ = 0x45300000;
  dVar3 = (double)integer_part *
          ((auVar4._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,SUB84(factor,0)) - 4503599627370496.0));
  uVar2 = (ulong)dVar3;
  return unit_scale * (long)factor +
         (uVar2 | (long)(dVar3 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f);
}

Assistant:

size_t parse_size(const char* str) {
  // input is like [0-9](\.[0-9]+)? *[KkMmGgTtPpEe]?[Bb]?
  // fortunately this can just be parsed left-to-right
  double fractional_part = 0.0;
  size_t integer_part = 0;
  size_t unit_scale = 1;
  for (; isdigit(*str); str++) {
    integer_part = integer_part * 10 + (*str - '0');
  }
  if (*str == '.') {
    str++;
    double factor = 0.1;
    for (; isdigit(*str); str++) {
      fractional_part += factor * (*str - '0');
      factor *= 0.1;
    }
  }
  for (; *str == ' '; str++) {
  }
#if SIZE_T_BITS >= 16
  if (*str == 'K' || *str == 'k') {
    unit_scale = KB_SIZE;
#if SIZE_T_BITS >= 32
  } else if (*str == 'M' || *str == 'm') {
    unit_scale = MB_SIZE;
  } else if (*str == 'G' || *str == 'g') {
    unit_scale = GB_SIZE;
#if SIZE_T_BITS == 64
  } else if (*str == 'T' || *str == 't') {
    unit_scale = TB_SIZE;
  } else if (*str == 'P' || *str == 'p') {
    unit_scale = PB_SIZE;
  } else if (*str == 'E' || *str == 'e') {
    unit_scale = EB_SIZE;
#endif
#endif
  }
#endif

  return integer_part * unit_scale + static_cast<size_t>(fractional_part * unit_scale);
}